

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importsource.cpp
# Opt level: O1

bool __thiscall libcellml::ImportSource::doEquals(ImportSource *this,EntityPtr *other)

{
  element_type *peVar1;
  EntityImpl *pEVar2;
  long lVar3;
  size_t __n;
  bool bVar4;
  int iVar5;
  long lVar6;
  byte unaff_BPL;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  long *local_48;
  size_t local_40;
  long local_38 [2];
  
  bVar4 = Entity::doEquals(&this->super_Entity,other);
  if (bVar4) {
    peVar1 = (other->super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (peVar1 == (element_type *)0x0) {
      lVar6 = 0;
    }
    else {
      lVar6 = __dynamic_cast(peVar1,&Entity::typeinfo,&typeinfo,0);
    }
    if (lVar6 == 0) {
      lVar6 = 0;
      this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      this_00 = (other->super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
    }
    if (lVar6 != 0) {
      pEVar2 = (this->super_Entity).mPimpl;
      lVar3 = *(long *)(*(long *)(lVar6 + 8) + 0x20);
      local_48 = local_38;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_48,lVar3,*(long *)(*(long *)(lVar6 + 8) + 0x28) + lVar3);
      __n = pEVar2[1].mId._M_string_length;
      if (__n == local_40) {
        if (__n == 0) {
          unaff_BPL = true;
        }
        else {
          iVar5 = bcmp(pEVar2[1].mId._M_dataplus._M_p,local_48,__n);
          unaff_BPL = iVar5 == 0;
        }
      }
      else {
        unaff_BPL = false;
      }
      if (local_48 != local_38) {
        operator_delete(local_48,local_38[0] + 1);
      }
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    if (lVar6 != 0) goto LAB_00232f4c;
  }
  unaff_BPL = 0;
LAB_00232f4c:
  return (bool)(unaff_BPL & 1);
}

Assistant:

bool ImportSource::doEquals(const EntityPtr &other) const
{
    if (Entity::doEquals(other)) {
        auto importSource = std::dynamic_pointer_cast<ImportSource>(other);
        if (importSource != nullptr) {
            return pFunc()->mUrl == importSource->url();
        }
    }
    return false;
}